

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes LookToRead_Look_Exact(void *pp,void **buf,size_t *size)

{
  SRes SVar1;
  ulong uVar2;
  
  uVar2 = *(long *)((long)pp + 0x30) - *(long *)((long)pp + 0x28);
  if (uVar2 == 0) {
    if (*size == 0) {
      SVar1 = 0;
    }
    else {
      *(undefined8 *)((long)pp + 0x28) = 0;
      if (0x4000 < *size) {
        *size = 0x4000;
      }
      SVar1 = (*(code *)**(undefined8 **)((long)pp + 0x20))
                        (*(undefined8 **)((long)pp + 0x20),(long)pp + 0x38,size);
      *(size_t *)((long)pp + 0x30) = *size;
    }
  }
  else {
    SVar1 = 0;
    if (uVar2 < *size) {
      *size = uVar2;
    }
  }
  *buf = (void *)((long)pp + *(long *)((long)pp + 0x28) + 0x38);
  return SVar1;
}

Assistant:

static SRes LookToRead_Look_Exact(void *pp, const void **buf, size_t *size)
{
  SRes res = SZ_OK;
  CLookToRead *p = (CLookToRead *)pp;
  size_t size2 = p->size - p->pos;
  if (size2 == 0 && *size > 0)
  {
    p->pos = 0;
    if (*size > LookToRead_BUF_SIZE)
      *size = LookToRead_BUF_SIZE;
    res = p->realStream->Read(p->realStream, p->buf, size);
    size2 = p->size = *size;
  }
  if (size2 < *size)
    *size = size2;
  *buf = p->buf + p->pos;
  return res;
}